

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lazy.h
# Opt level: O0

expected<void,_std::errc> __thiscall
async_simple::coro::detail::LazyAwaiterBase<tl::expected<void,_std::errc>_>::awaitResume
          (LazyAwaiterBase<tl::expected<void,_std::errc>_> *this)

{
  expected_storage_base<void,_std::errc,_false,_true> eVar1;
  expected<void,_std::errc> *peVar2;
  coroutine_handle<async_simple::coro::detail::LazyPromise<tl::expected<void,_std::errc>_>_> *in_RDI
  ;
  LazyPromise<tl::expected<void,_std::errc>_> *unaff_retaddr;
  expected<void,_std::errc> r;
  
  std::coroutine_handle<async_simple::coro::detail::LazyPromise<tl::expected<void,_std::errc>_>_>::
  promise(in_RDI);
  peVar2 = LazyPromise<tl::expected<void,_std::errc>_>::result(unaff_retaddr);
  eVar1 = (peVar2->super_expected_move_assign_base<void,_std::errc,_true>).
          super_expected_copy_assign_base<void,_std::errc,_true>.
          super_expected_move_base<void,_std::errc,_true>.
          super_expected_copy_base<void,_std::errc,_true>.
          super_expected_operations_base<void,_std::errc>.
          super_expected_storage_base<void,_std::errc,_false,_true>;
  std::coroutine_handle<async_simple::coro::detail::LazyPromise<tl::expected<void,_std::errc>_>_>::
  destroy((coroutine_handle<async_simple::coro::detail::LazyPromise<tl::expected<void,_std::errc>_>_>
           *)0x473a62);
  std::coroutine_handle<async_simple::coro::detail::LazyPromise<tl::expected<void,_std::errc>_>_>::
  operator=(in_RDI,(nullptr_t)0x0);
  return (expected<void,_std::errc>)eVar1;
}

Assistant:

auto awaitResume() {
        if constexpr (std::is_void_v<T>) {
            _handle.promise().result();
            // We need to destroy the handle expclictly since the awaited
            // coroutine after symmetric transfer couldn't release it self any
            // more.
            _handle.destroy();
            _handle = nullptr;
        } else {
            auto r = std::move(_handle.promise()).result();
            _handle.destroy();
            _handle = nullptr;
            return r;
        }
    }